

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_util.cpp
# Opt level: O2

idx_t duckdb::ArrowUtil::FetchChunk
                (ChunkScanState *scan_state,ClientProperties *options,idx_t chunk_size,
                ArrowArray *out,
                unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *extension_type_cast)

{
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  extension_type_cast_00;
  bool bVar1;
  idx_t result_count;
  ErrorData error;
  undefined8 in_stack_fffffffffffffec0;
  idx_t in_stack_fffffffffffffec8;
  string in_stack_fffffffffffffed0;
  ClientProperties local_110;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e0;
  ErrorData local_a8;
  
  ErrorData::ErrorData(&local_a8);
  ClientProperties::ClientProperties(&local_110,options);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_e0,&extension_type_cast->_M_h);
  extension_type_cast_00._M_h._M_bucket_count = in_stack_fffffffffffffec0;
  extension_type_cast_00._M_h._M_buckets = (__buckets_ptr)&local_e0;
  extension_type_cast_00._M_h._M_before_begin._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffec8;
  extension_type_cast_00._M_h._24_32_ = in_stack_fffffffffffffed0;
  bVar1 = TryFetchChunk(scan_state,&local_110,chunk_size,out,(idx_t *)&stack0xfffffffffffffec8,
                        &local_a8,extension_type_cast_00);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e0);
  ::std::__cxx11::string::~string((string *)&local_110);
  if (bVar1) {
    ErrorData::~ErrorData(&local_a8);
    return in_stack_fffffffffffffec8;
  }
  ::std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffed0,anon_var_dwarf_4bacfca + 9,
             (allocator *)&stack0xfffffffffffffec7);
  ErrorData::Throw(&local_a8,(string *)&stack0xfffffffffffffed0);
}

Assistant:

idx_t ArrowUtil::FetchChunk(ChunkScanState &scan_state, ClientProperties options, idx_t chunk_size, ArrowArray *out,
                            const unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> &extension_type_cast) {
	ErrorData error;
	idx_t result_count;
	if (!TryFetchChunk(scan_state, std::move(options), chunk_size, out, result_count, error, extension_type_cast)) {
		error.Throw();
	}
	return result_count;
}